

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O0

bool bssl::spake2plus::Register
               (Span<unsigned_char> out_w0,Span<unsigned_char> out_w1,
               Span<unsigned_char> out_registration_record,Span<const_unsigned_char> password,
               Span<const_unsigned_char> id_prover,Span<const_unsigned_char> id_verifier)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  cbb_st *pcVar4;
  size_t sVar5;
  size_t sVar6;
  uint8_t *password_00;
  EC_GROUP *group_00;
  uchar *buf;
  Span<unsigned_char> out_buf;
  Span<unsigned_char> out_buf_00;
  Span<const_unsigned_char> bytes;
  Span<const_unsigned_char> bytes_00;
  Span<const_unsigned_char> bytes_01;
  undefined1 local_378 [8];
  EC_AFFINE L;
  EC_JACOBIAN L_j;
  undefined1 local_200 [8];
  EC_SCALAR w1;
  BN_ULONG w1_words [5];
  undefined1 local_180 [8];
  EC_SCALAR w0;
  BN_ULONG w0_words [5];
  EC_GROUP *group;
  uint8_t key [80];
  size_t kKDFOutputWords;
  size_t kKDFOutputSize;
  undefined1 local_70 [8];
  ScopedCBB mhf_input;
  Span<unsigned_char> out_registration_record_local;
  Span<unsigned_char> out_w1_local;
  Span<unsigned_char> out_w0_local;
  
  out_w1_local.data_ = (uchar *)out_w1.size_;
  out_registration_record_local.size_ = (size_t)out_w1.data_;
  out_w1_local.size_ = (size_t)out_w0.data_;
  out_registration_record_local.data_ = (uchar *)out_registration_record.size_;
  mhf_input.ctx_.u._24_8_ = out_registration_record.data_;
  sVar3 = Span<unsigned_char>::size((Span<unsigned_char> *)&out_w1_local.size_);
  if (((sVar3 != 0x20) ||
      (sVar3 = Span<unsigned_char>::size
                         ((Span<unsigned_char> *)&out_registration_record_local.size_),
      sVar3 != 0x20)) ||
     (sVar3 = Span<unsigned_char>::size((Span<unsigned_char> *)((long)&mhf_input.ctx_.u + 0x18)),
     sVar3 != 0x41)) {
    ERR_put_error(0xe,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                  ,0xb3);
    return false;
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_70);
  pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_70);
  sVar3 = Span<const_unsigned_char>::size(&password);
  sVar5 = Span<const_unsigned_char>::size(&id_prover);
  sVar6 = Span<const_unsigned_char>::size(&id_verifier);
  iVar2 = CBB_init(pcVar4,sVar3 + sVar5 + sVar6 + 0x18);
  if (iVar2 != 0) {
    pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_70);
    bytes.size_ = (size_t)password.data_;
    bytes.data_ = (uchar *)password.size_;
    bVar1 = anon_unknown_0::AddLengthPrefixed((anon_unknown_0 *)pcVar4,(CBB *)password.data_,bytes);
    if (bVar1) {
      pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_70);
      bytes_00.size_ = (size_t)id_prover.data_;
      bytes_00.data_ = (uchar *)id_prover.size_;
      bVar1 = anon_unknown_0::AddLengthPrefixed
                        ((anon_unknown_0 *)pcVar4,(CBB *)id_prover.data_,bytes_00);
      if (bVar1) {
        pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_70);
        bytes_01.size_ = (size_t)id_verifier.data_;
        bytes_01.data_ = (uchar *)id_verifier.size_;
        bVar1 = anon_unknown_0::AddLengthPrefixed
                          ((anon_unknown_0 *)pcVar4,(CBB *)id_verifier.data_,bytes_01);
        if (bVar1) {
          pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_70);
          iVar2 = CBB_flush(pcVar4);
          if (iVar2 != 0) {
            key[0x48] = '\n';
            key[0x49] = '\0';
            key[0x4a] = '\0';
            key[0x4b] = '\0';
            key[0x4c] = '\0';
            key[0x4d] = '\0';
            key[0x4e] = '\0';
            key[0x4f] = '\0';
            pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_70);
            password_00 = CBB_data(pcVar4);
            pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_70);
            sVar3 = CBB_len(pcVar4);
            sVar5 = 0x8000;
            iVar2 = EVP_PBE_scrypt((char *)password_00,sVar3,(uint8_t *)0x0,0,0x8000,8,1,0x2100000,
                                   (uint8_t *)&group,0x50);
            if (iVar2 == 0) {
              ERR_put_error(0xe,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                            ,0xe0);
              out_w0_local.size_._7_1_ = false;
            }
            else {
              group_00 = EC_group_p256();
              bn_big_endian_to_words(w0.words + 8,5,(uint8_t *)&group,0x28);
              ec_scalar_reduce(group_00,(EC_SCALAR *)local_180,w0.words + 8,5);
              out_buf.size_ = sVar5;
              out_buf.data_ = (uchar *)out_w0.size_;
              anon_unknown_0::ScalarToSizedBuffer
                        ((anon_unknown_0 *)group_00,(EC_GROUP *)local_180,
                         (EC_SCALAR *)out_w1_local.size_,out_buf);
              bn_big_endian_to_words(w1.words + 8,5,key + 0x20,0x28);
              ec_scalar_reduce(group_00,(EC_SCALAR *)local_200,w1.words + 8,5);
              out_buf_00.size_ = sVar5;
              out_buf_00.data_ = out_w1_local.data_;
              anon_unknown_0::ScalarToSizedBuffer
                        ((anon_unknown_0 *)group_00,(EC_GROUP *)local_200,
                         (EC_SCALAR *)out_registration_record_local.size_,out_buf_00);
              iVar2 = ec_point_mul_scalar_base
                                (group_00,(EC_JACOBIAN *)(L.Y.words + 8),(EC_SCALAR *)local_200);
              if ((iVar2 != 0) &&
                 (iVar2 = ec_jacobian_to_affine
                                    (group_00,(EC_AFFINE *)local_378,(EC_JACOBIAN *)(L.Y.words + 8))
                 , iVar2 != 0)) {
                buf = Span<unsigned_char>::data
                                ((Span<unsigned_char> *)((long)&mhf_input.ctx_.u + 0x18));
                sVar3 = ec_point_to_bytes(group_00,(EC_AFFINE *)local_378,
                                          POINT_CONVERSION_UNCOMPRESSED,buf,0x41);
                if (sVar3 != 0) {
                  out_w0_local.size_._7_1_ = true;
                  goto LAB_0022a397;
                }
              }
              ERR_put_error(0xe,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                            ,0xfa);
              out_w0_local.size_._7_1_ = false;
            }
            goto LAB_0022a397;
          }
        }
      }
    }
  }
  ERR_put_error(0xe,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                ,0xc1);
  out_w0_local.size_._7_1_ = false;
LAB_0022a397:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_70);
  return out_w0_local.size_._7_1_;
}

Assistant:

bool Register(Span<uint8_t> out_w0, Span<uint8_t> out_w1,
              Span<uint8_t> out_registration_record,
              Span<const uint8_t> password, Span<const uint8_t> id_prover,
              Span<const uint8_t> id_verifier) {
  if (out_w0.size() != kVerifierSize || out_w1.size() != kVerifierSize ||
      out_registration_record.size() != kRegistrationRecordSize) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // Offline registration format from:
  // https://www.rfc-editor.org/rfc/rfc9383.html#section-3.2
  ScopedCBB mhf_input;
  if (!CBB_init(mhf_input.get(), password.size() + id_prover.size() +
                                     id_verifier.size() +
                                     3 * sizeof(uint64_t)) ||  //
      !AddLengthPrefixed(mhf_input.get(), password) ||
      !AddLengthPrefixed(mhf_input.get(), id_prover) ||
      !AddLengthPrefixed(mhf_input.get(), id_verifier) ||
      !CBB_flush(mhf_input.get())) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // https://neuromancer.sk/std/nist/P-256
  //   sage: p =
  //   0xffffffff00000001000000000000000000000000ffffffffffffffffffffffff
  //   ....: K = GF(p)
  //   ....: a =
  //   K(0xffffffff00000001000000000000000000000000fffffffffffffffffffffffc)
  //   ....: b =
  //   K(0x5ac635d8aa3a93e7b3ebbd55769886bc651d06b0cc53b0f63bce3c3e27d2604b)
  //   ....: E = EllipticCurve(K, (a, b))
  //   ....: G =
  //   E(0x6b17d1f2e12c4247f8bce6e563a440f277037d812deb33a0f4a13945d898c296,
  //   ....: 0x4fe342e2fe1a7f9b8ee7eb4a7c0f9e162bce33576b315ececbb6406837bf51f5)
  //   ....:
  //   E.set_order(0xffffffff00000000ffffffffffffffffbce6faada7179e84f3b9cac2fc63
  //   ....: 2551 * 0x1)
  //   sage: k = 64
  //   sage: L = (2 * (ceil(log(p)/log(2)) + k)) / 8

  // RFC 9383 Section 3.2
  constexpr size_t kKDFOutputSize = 80;
  constexpr size_t kKDFOutputWords = kKDFOutputSize / BN_BYTES;

  uint8_t key[kKDFOutputSize];
  if (!EVP_PBE_scrypt((const char *)CBB_data(mhf_input.get()),
                      CBB_len(mhf_input.get()), nullptr, 0,
                      /*N=*/32768, /*r=*/8, /*p=*/1,
                      /*max_mem=*/1024 * 1024 * 33, key, kKDFOutputSize)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const EC_GROUP *group = EC_group_p256();
  BN_ULONG w0_words[kKDFOutputWords / 2];
  bn_big_endian_to_words(w0_words, kKDFOutputWords / 2, key,
                         kKDFOutputSize / 2);
  EC_SCALAR w0;
  ec_scalar_reduce(group, &w0, w0_words, kKDFOutputWords / 2);
  ScalarToSizedBuffer(group, &w0, out_w0);

  BN_ULONG w1_words[kKDFOutputWords / 2];
  bn_big_endian_to_words(w1_words, kKDFOutputWords / 2,
                         key + kKDFOutputSize / 2, kKDFOutputSize / 2);
  EC_SCALAR w1;
  ec_scalar_reduce(group, &w1, w1_words, kKDFOutputWords / 2);
  ScalarToSizedBuffer(group, &w1, out_w1);

  EC_JACOBIAN L_j;
  EC_AFFINE L;
  if (!ec_point_mul_scalar_base(group, &L_j, &w1) ||  //
      !ec_jacobian_to_affine(group, &L, &L_j) ||      //
      !ec_point_to_bytes(group, &L, POINT_CONVERSION_UNCOMPRESSED,
                         out_registration_record.data(),
                         kRegistrationRecordSize)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  return true;
}